

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O1

bool __thiscall
google::protobuf::compiler::python::Generator::GeneratingDescriptorProto(Generator *this)

{
  int iVar1;
  bool bVar2;
  
  iVar1 = std::__cxx11::string::compare(*(char **)this->file_);
  if (iVar1 == 0) {
    bVar2 = true;
  }
  else {
    iVar1 = std::__cxx11::string::compare(*(char **)this->file_);
    bVar2 = iVar1 == 0;
  }
  return bVar2;
}

Assistant:

bool Generator::GeneratingDescriptorProto() const {
  return file_->name() == "net/proto2/proto/descriptor.proto" ||
         file_->name() == "google/protobuf/descriptor.proto";
}